

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlNodeSet.cpp
# Opt level: O1

iterator __thiscall opencollada::XmlNodeSet::begin(XmlNodeSet *this)

{
  xmlNodeSetPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  iterator iVar3;
  
  if (this->mXPathObject == (xmlXPathObjectPtr)0x0) {
    pxVar2 = (xmlNodeSetPtr)0x0;
  }
  else {
    pxVar1 = this->mXPathObject->nodesetval;
    pxVar2 = (xmlNodeSetPtr)0x0;
    if ((pxVar1 != (xmlNodeSetPtr)0x0) && (pxVar1->nodeNr != 0)) {
      pxVar2 = pxVar1;
    }
  }
  iVar3._8_8_ = 0;
  iVar3.mNodeSet = pxVar2;
  return iVar3;
}

Assistant:

XmlNodeSet::iterator XmlNodeSet::begin() const
	{
		if (!mXPathObject)
			return iterator();
		if (!mXPathObject->nodesetval)
			return iterator();
		if (mXPathObject->nodesetval->nodeNr == 0)
			return iterator();
		return iterator(mXPathObject->nodesetval);
	}